

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_dispatch.cpp
# Opt level: O2

bool __thiscall FButtonStatus::PressKey(FButtonStatus *this,int keynum)

{
  BYTE BVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  
  uVar6 = keynum & 0x7fff;
  if (uVar6 == 0) {
    this->Keys[0] = 0xffff;
    for (lVar4 = 10; lVar4 != 0; lVar4 = lVar4 + -2) {
      *(undefined2 *)((long)this->Keys + lVar4) = 0;
    }
  }
  else {
    uVar5 = 0xffffffff;
    for (uVar3 = 5; -1 < (int)uVar3; uVar3 = uVar3 - 1) {
      uVar2 = uVar3;
      if ((this->Keys[uVar3] != 0) && (uVar2 = uVar5, uVar6 == this->Keys[uVar3])) {
        return false;
      }
      uVar5 = uVar2;
    }
    if ((int)uVar5 < 0) {
      Printf("More than %u keys pressed for a single action!\n",6);
      return false;
    }
    this->Keys[uVar5] = (WORD)uVar6;
  }
  BVar1 = this->bDown;
  this->bDown = '\x01';
  this->bWentDown = '\x01';
  return BVar1 == '\0';
}

Assistant:

bool FButtonStatus::PressKey (int keynum)
{
	int i, open;

	keynum &= KEY_DBLCLICKED-1;

	if (keynum == 0)
	{ // Issued from console instead of a key, so force on
		Keys[0] = 0xffff;
		for (i = MAX_KEYS-1; i > 0; --i)
		{
			Keys[i] = 0;
		}
	}
	else
	{
		for (i = MAX_KEYS-1, open = -1; i >= 0; --i)
		{
			if (Keys[i] == 0)
			{
				open = i;
			}
			else if (Keys[i] == keynum)
			{ // Key is already down; do nothing
				return false;
			}
		}
		if (open < 0)
		{ // No free key slots, so do nothing
			Printf ("More than %u keys pressed for a single action!\n", MAX_KEYS);
			return false;
		}
		Keys[open] = keynum;
	}
	BYTE wasdown = bDown;
	bDown = bWentDown = true;
	// Returns true if this key caused the button to go down.
	return !wasdown;
}